

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  Index IVar1;
  ModuleCommand *pMVar2;
  Module *pMVar3;
  
  IVar1 = BindingHash::FindIndex(&this->module_bindings,var);
  if ((ulong)IVar1 < (ulong)(*(long *)&this->field_0x8 - *(long *)this >> 3)) {
    pMVar2 = cast<wabt::ModuleCommand,wabt::Command>
                       (*(Command **)(*(long *)this + (ulong)IVar1 * 8));
    pMVar3 = (Module *)(pMVar2 + 0x10);
  }
  else {
    pMVar3 = (Module *)0x0;
  }
  return pMVar3;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = cast<ModuleCommand>(commands[index].get());
  return &command->module;
}